

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

golf_movement_t * golf_entity_get_movement(golf_entity_t *entity)

{
  if ((entity->type != GEO_ENTITY) && (entity->type != MODEL_ENTITY)) {
    return (golf_movement_t *)0x0;
  }
  return (golf_movement_t *)((long)&entity->field_4 + 0x88);
}

Assistant:

golf_movement_t *golf_entity_get_movement(golf_entity_t *entity) {
    switch (entity->type) {
        case MODEL_ENTITY: {
            return &entity->model.movement;
        }
        case GEO_ENTITY: {
            return &entity->geo.movement;
        }
        case BALL_START_ENTITY: 
        case WATER_ENTITY: 
        case HOLE_ENTITY: 
        case BEGIN_ANIMATION_ENTITY:
        case CAMERA_ZONE_ENTITY:
        case GROUP_ENTITY: {
            return NULL;
        }
    }
    return NULL;
}